

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O0

Abc_Ntk_t * Mpm_ManCellMapping(Gia_Man_t *pGia,Mpm_Par_t *pPars,void *pMio)

{
  Gia_Man_t *p_00;
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNew;
  Mig_Man_t *p;
  void *pMio_local;
  Mpm_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if (pMio == (void *)0x0) {
    __assert_fail("pMio != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                  ,0x11d,"Abc_Ntk_t *Mpm_ManCellMapping(Gia_Man_t *, Mpm_Par_t *, void *)");
  }
  if (pPars->pLib->LutMax < 0xd) {
    if (pPars->nNumCuts < 0x21) {
      if (pPars->fUseGates == 0) {
        pNew = (Abc_Ntk_t *)Mig_ManCreate(pGia);
      }
      else {
        p_00 = Gia_ManDupMuxes(pGia,2);
        pNew = (Abc_Ntk_t *)Mig_ManCreate(p_00);
        Gia_ManStop(p_00);
      }
      pAVar1 = Mpm_ManPerformCellMapping((Mig_Man_t *)pNew,pPars,(Mio_Library_t *)pMio);
      Mig_ManStop((Mig_Man_t *)pNew);
      return pAVar1;
    }
    __assert_fail("pPars->nNumCuts <= MPM_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                  ,0x11f,"Abc_Ntk_t *Mpm_ManCellMapping(Gia_Man_t *, Mpm_Par_t *, void *)");
  }
  __assert_fail("pPars->pLib->LutMax <= MPM_VAR_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                ,0x11e,"Abc_Ntk_t *Mpm_ManCellMapping(Gia_Man_t *, Mpm_Par_t *, void *)");
}

Assistant:

Abc_Ntk_t * Mpm_ManCellMapping( Gia_Man_t * pGia, Mpm_Par_t * pPars, void * pMio )
{
    Mig_Man_t * p;
    Abc_Ntk_t * pNew;
    assert( pMio != NULL );
    assert( pPars->pLib->LutMax <= MPM_VAR_MAX );
    assert( pPars->nNumCuts <= MPM_CUT_MAX );
    if ( pPars->fUseGates )
    {
        pGia = Gia_ManDupMuxes( pGia, 2 );
        p = Mig_ManCreate( pGia );
        Gia_ManStop( pGia );
    }
    else
        p = Mig_ManCreate( pGia );
    pNew = Mpm_ManPerformCellMapping( p, pPars, (Mio_Library_t *)pMio );
    Mig_ManStop( p );
    return pNew;
}